

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O1

aiString * __thiscall
Assimp::ColladaLoader::FindFilenameForEffectTexture
          (aiString *__return_storage_ptr__,ColladaLoader *this,ColladaParser *pParser,
          Effect *pEffect,string *pName)

{
  pointer *pppaVar1;
  pointer pcVar2;
  char *__s;
  _Base_ptr p_Var3;
  iterator __position;
  undefined8 uVar4;
  undefined8 uVar5;
  ai_uint32 aVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  aiTexture *paVar9;
  size_t sVar10;
  Logger *pLVar11;
  aiTexel *__dest;
  runtime_error *this_00;
  aiTexture *__dest_00;
  _Rb_tree_header *p_Var12;
  string name;
  aiTexture *tex;
  key_type local_1f0;
  ColladaLoader *local_1d0;
  char *local_1c8;
  char local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  __return_storage_ptr__->length = 0;
  __dest_00 = (aiTexture *)__return_storage_ptr__->data;
  __return_storage_ptr__->data[0] = '\0';
  local_1d0 = this;
  memset(__return_storage_ptr__->data + 1,0x1b,0x3ff);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  pcVar2 = (pName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,pcVar2,pcVar2 + pName->_M_string_length);
  p_Var12 = &(pEffect->mParams)._M_t._M_impl.super__Rb_tree_header;
  do {
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::EffectParam>_>_>
            ::find(&(pEffect->mParams)._M_t,&local_1f0);
    if ((_Rb_tree_header *)cVar7._M_node == p_Var12) break;
    std::__cxx11::string::_M_assign((string *)&local_1f0);
  } while ((_Rb_tree_header *)cVar7._M_node != p_Var12);
  paVar9 = (aiTexture *)&pParser->mImageLibrary;
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
                  *)paVar9,&local_1f0);
  if ((_Rb_tree_header *)cVar8._M_node ==
      &(pParser->mImageLibrary)._M_t._M_impl.super__Rb_tree_header) {
    pLVar11 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[50]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [50])"Collada: Unable to resolve effect texture entry \"");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(pName->_M_dataplus)._M_p,pName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\", ended up at ID \"",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar11,local_1c8);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    local_1a8._0_8_ = (aiTexture *)(local_1a8 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_1f0._M_dataplus._M_p,
               local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
    std::__cxx11::string::append(local_1a8);
    if ((ulong)local_1a8._8_8_ < 0x400) {
      __return_storage_ptr__->length = (ai_uint32)local_1a8._8_8_;
      memcpy(__dest_00,(void *)local_1a8._0_8_,local_1a8._8_8_);
      __return_storage_ptr__->data[local_1a8._8_8_] = '\0';
    }
    paVar9 = (aiTexture *)local_1a8._0_8_;
    if ((aiTexture *)local_1a8._0_8_ != (aiTexture *)(local_1a8 + 0x10)) {
      operator_delete((void *)local_1a8._0_8_);
    }
  }
  else {
    if (*(_Base_ptr *)(cVar8._M_node + 3) != cVar8._M_node[3]._M_parent) {
      paVar9 = (aiTexture *)operator_new(0x428);
      paVar9->mWidth = 0;
      paVar9->mHeight = 0;
      paVar9->pcData = (aiTexel *)0x0;
      (paVar9->mFilename).length = 0;
      (paVar9->mFilename).data[0] = '\0';
      memset((paVar9->mFilename).data + 1,0x1b,0x3ff);
      paVar9->achFormatHint[0] = '\0';
      paVar9->achFormatHint[1] = '\0';
      paVar9->achFormatHint[2] = '\0';
      paVar9->achFormatHint[3] = '\0';
      __s = *(char **)(cVar8._M_node + 2);
      local_1a8._0_8_ = paVar9;
      sVar10 = strlen(__s);
      aVar6 = (ai_uint32)sVar10;
      if ((int)aVar6 < 0x400) {
        (paVar9->mFilename).length = aVar6;
        memcpy((paVar9->mFilename).data,__s,(long)(int)aVar6);
        (paVar9->mFilename).data[(int)aVar6] = '\0';
      }
      p_Var3 = cVar8._M_node[2]._M_parent;
      if (p_Var3 < (_Base_ptr)0x400) {
        __return_storage_ptr__->length = (ai_uint32)p_Var3;
        memcpy(__dest_00,*(void **)(cVar8._M_node + 2),(size_t)p_Var3);
        __return_storage_ptr__->data[(long)p_Var3] = '\0';
      }
      if (3 < *(ulong *)(cVar8._M_node + 4)) {
        pLVar11 = DefaultLogger::get();
        Logger::warn(pLVar11,"Collada: texture format hint is too long, truncating to 3 characters")
        ;
      }
      uVar4 = local_1a8._0_8_;
      strncpy((char *)(local_1a8._0_8_ + 8),(char *)cVar8._M_node[3]._M_right,3);
      uVar5 = local_1a8._0_8_;
      *(uint *)(uVar4 + 4) = 0;
      *(uint *)local_1a8._0_8_ = *(int *)&cVar8._M_node[3]._M_parent - cVar8._M_node[3]._M_color;
      __dest = (aiTexel *)operator_new__((ulong)*(uint *)local_1a8._0_8_);
      *(aiTexel **)(uVar5 + 0x18) = __dest;
      memcpy(__dest,*(void **)(cVar8._M_node + 3),(ulong)*(uint *)uVar5);
      __position._M_current =
           (local_1d0->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (local_1d0->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiTexture*,std::allocator<aiTexture*>>::_M_realloc_insert<aiTexture*const&>
                  ((vector<aiTexture*,std::allocator<aiTexture*>> *)&local_1d0->mTextures,__position
                   ,(aiTexture **)local_1a8);
      }
      else {
        *__position._M_current = (aiTexture *)uVar5;
        pppaVar1 = &(local_1d0->mTextures).
                    super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppaVar1 = *pppaVar1 + 1;
      }
      goto LAB_00412325;
    }
    p_Var3 = cVar8._M_node[2]._M_parent;
    if (p_Var3 == (_Base_ptr)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"Collada: Invalid texture, no data or file reference given","")
      ;
      std::runtime_error::runtime_error(this_00,(string *)local_1a8);
      *(undefined ***)this_00 = &PTR__runtime_error_0081d260;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (p_Var3 < (_Base_ptr)0x400) {
      __return_storage_ptr__->length = (ai_uint32)p_Var3;
      memcpy(__dest_00,*(void **)(cVar8._M_node + 2),(size_t)p_Var3);
      __return_storage_ptr__->data[(long)p_Var3] = '\0';
      paVar9 = __dest_00;
    }
  }
  ConvertPath((ColladaLoader *)paVar9,__return_storage_ptr__);
LAB_00412325:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

aiString ColladaLoader::FindFilenameForEffectTexture(const ColladaParser& pParser,
    const Collada::Effect& pEffect, const std::string& pName)
{
    aiString result;

    // recurse through the param references until we end up at an image
    std::string name = pName;
    while (1)
    {
        // the given string is a param entry. Find it
        Collada::Effect::ParamLibrary::const_iterator it = pEffect.mParams.find(name);
        // if not found, we're at the end of the recursion. The resulting string should be the image ID
        if (it == pEffect.mParams.end())
            break;

        // else recurse on
        name = it->second.mReference;
    }

    // find the image referred by this name in the image library of the scene
    ColladaParser::ImageLibrary::const_iterator imIt = pParser.mImageLibrary.find(name);
    if (imIt == pParser.mImageLibrary.end())
    {
        ASSIMP_LOG_WARN_F("Collada: Unable to resolve effect texture entry \"", pName, "\", ended up at ID \"", name, "\".");

        //set default texture file name
        result.Set(name + ".jpg");
        ConvertPath(result);
        return result;
    }

    // if this is an embedded texture image setup an aiTexture for it
    if (!imIt->second.mImageData.empty())
    {
        aiTexture* tex = new aiTexture();

        // Store embedded texture name reference
        tex->mFilename.Set(imIt->second.mFileName.c_str());
        result.Set(imIt->second.mFileName);

        // TODO: check the possibility of using the flag "AI_CONFIG_IMPORT_FBX_EMBEDDED_TEXTURES_LEGACY_NAMING"
//        result.data[0] = '*';
//        result.length = 1 + ASSIMP_itoa10(result.data + 1, static_cast<unsigned int>(MAXLEN - 1), static_cast<int32_t>(mTextures.size()));


        // setup format hint
        if (imIt->second.mEmbeddedFormat.length() > 3) {
            ASSIMP_LOG_WARN("Collada: texture format hint is too long, truncating to 3 characters");
        }
        strncpy(tex->achFormatHint, imIt->second.mEmbeddedFormat.c_str(), 3);

        // and copy texture data
        tex->mHeight = 0;
        tex->mWidth = static_cast<unsigned int>(imIt->second.mImageData.size());
        tex->pcData = (aiTexel*)new char[tex->mWidth];
        memcpy(tex->pcData, &imIt->second.mImageData[0], tex->mWidth);

        // and add this texture to the list
        mTextures.push_back(tex);
    }
    else
    {
        if (imIt->second.mFileName.empty()) {
            throw DeadlyImportError("Collada: Invalid texture, no data or file reference given");
        }

        result.Set(imIt->second.mFileName);
        ConvertPath(result);
    }
    return result;
}